

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveVectors(FastText *this,string *filename)

{
  bool bVar1;
  byte bVar2;
  int32_t iVar3;
  runtime_error *this_00;
  invalid_argument *this_01;
  element_type *peVar4;
  ostream *poVar5;
  ostream *this_02;
  element_type *peVar6;
  ostream *os;
  string *in_RSI;
  long in_RDI;
  string word;
  int32_t i;
  Vector vec;
  ofstream ofs;
  ostream *in_stack_fffffffffffffd20;
  int32_t id;
  int iVar7;
  char *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  float in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  string *in_stack_fffffffffffffd80;
  Vector *in_stack_fffffffffffffd88;
  FastText *in_stack_fffffffffffffd90;
  int local_264;
  string local_240 [32];
  ostream local_220 [528];
  string *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x20));
  if ((bVar1) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x30)), bVar1)) {
    std::ofstream::ofstream(local_220,local_10,_S_out);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) != 0) {
      peVar4 = std::
               __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a9b57);
      iVar3 = Dictionary::nwords(peVar4);
      poVar5 = (ostream *)std::ostream::operator<<(local_220,iVar3);
      this_02 = std::operator<<(poVar5," ");
      peVar6 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a9b9f);
      os = (ostream *)std::ostream::operator<<(this_02,peVar6->dim);
      std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
      std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1a9bd3);
      Vector::Vector((Vector *)poVar5,(int64_t)this_02);
      local_264 = 0;
      while( true ) {
        id = (int32_t)((ulong)in_stack_fffffffffffffd20 >> 0x20);
        iVar7 = local_264;
        peVar4 = std::
                 __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1a9c0d);
        iVar3 = Dictionary::nwords(peVar4);
        if (iVar3 <= iVar7) break;
        std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a9c39);
        Dictionary::getWord_abi_cxx11_((Dictionary *)CONCAT44(iVar3,iVar7),id);
        getWordVector(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                      in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78);
        in_stack_fffffffffffffd20 = std::operator<<(local_220,(string *)&stack0xfffffffffffffd78);
        std::operator<<(in_stack_fffffffffffffd20," ");
        poVar5 = operator<<(os,(Vector *)CONCAT44(iVar3,iVar7));
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
        local_264 = local_264 + 1;
      }
      std::ofstream::close();
      Vector::~Vector((Vector *)0x1a9d3d);
      std::ofstream::~ofstream(local_220);
      return;
    }
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    std::invalid_argument::invalid_argument(this_01,local_240);
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Model never trained");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FastText::saveVectors(const std::string& filename) {
  if (!input_ || !output_) {
    throw std::runtime_error("Model never trained");
  }
  std::ofstream ofs(filename);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        filename + " cannot be opened for saving vectors!");
  }
  ofs << dict_->nwords() << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
    getWordVector(vec, word);
    ofs << word << " " << vec << std::endl;
  }
  ofs.close();
}